

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.h
# Opt level: O0

void __thiscall
Js::AsmJsModuleInfo::SetFunctionTable(AsmJsModuleInfo *this,int i,ModuleFunctionTable *var)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ModuleFunctionTable **ppMVar4;
  ModuleFunctionTable *var_local;
  int i_local;
  AsmJsModuleInfo *this_local;
  
  if (this->mFunctionTableCount <= i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsModule.h"
                                ,0x1c2,"(i < mFunctionTableCount)","i < mFunctionTableCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_ModuleFunctionTable__
                      ((WriteBarrierPtr *)&this->mFunctionTables);
  ModuleFunctionTable::operator=(*ppMVar4 + i,var);
  return;
}

Assistant:

void SetFunctionTable(int i, ModuleFunctionTable var)
        {
            Assert(i < mFunctionTableCount);
            mFunctionTables[i] = var;
        }